

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# database.cpp
# Opt level: O3

string * __thiscall
pstore::database::build_sync_name_abi_cxx11_
          (string *__return_storage_ptr__,database *this,header *header)

{
  pointer pcVar1;
  uint128 val;
  base32 *this_00;
  ulong uVar2;
  undefined8 unaff_RBX;
  undefined8 unaff_retaddr;
  
  this_00 = (base32 *)uint128::bytes_to_uint128((uint8_t *)&(this->storage_).file_);
  val.v_._8_8_ = unaff_retaddr;
  val.v_._0_8_ = unaff_RBX;
  base32::convert<pstore::uint128>(__return_storage_ptr__,this_00,val);
  uVar2 = 0x14;
  if (__return_storage_ptr__->_M_string_length < 0x14) {
    uVar2 = __return_storage_ptr__->_M_string_length;
  }
  pcVar1 = (__return_storage_ptr__->_M_dataplus)._M_p;
  __return_storage_ptr__->_M_string_length = uVar2;
  pcVar1[uVar2] = '\0';
  return __return_storage_ptr__;
}

Assistant:

std::string database::build_sync_name (header const & header) {
        auto name = base32::convert (uint128{header.a.id.array ()});
        name.erase (std::min (sync_name_length, name.length ()));
        return name;
    }